

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzadmchunk.h
# Opt level: O2

void __thiscall
TPZAdmChunkVector<TPZGeoNode,_10>::Resize(TPZAdmChunkVector<TPZGeoNode,_10> *this,int newsize)

{
  TPZStack<int,_10> *this_00;
  int64_t iVar1;
  int *piVar2;
  uint object;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  TPZStack<int,_10> temp;
  TPZManVector<int,_10> local_70;
  
  if (-1 < newsize) {
    TPZChunkVector<TPZGeoNode,_10>::Resize
              (&this->super_TPZChunkVector<TPZGeoNode,_10>,(ulong)(uint)newsize);
    iVar1 = (this->fNFree).super_TPZVec<int>.fNElements;
    iVar6 = (int)(this->super_TPZChunkVector<TPZGeoNode,_10>).fVec.super_TPZVec<TPZGeoNode_*>.
                 fNElements;
    TPZManVector<int,_10>::Resize(&this->fNFree,(long)iVar6);
    piVar2 = (this->fNFree).super_TPZVec<int>.fStore;
    iVar5 = (int)iVar1;
    for (lVar4 = (long)iVar5; lVar4 < iVar6; lVar4 = lVar4 + 1) {
      piVar2[lVar4] = 0;
    }
    if (iVar6 <= iVar5) {
      this_00 = &this->fFree;
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_70,this_00);
      TPZManVector<int,_10>::Resize(&local_70,0);
      while (0 < (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements) {
        object = TPZStack<int,_10>::Pop(this_00);
        if ((int)object < newsize) {
          TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_70,object);
        }
        else if (object >> 10 == iVar6 - 1U) {
          piVar2 = (this->fNFree).super_TPZVec<int>.fStore + (iVar6 - 1U);
          *piVar2 = *piVar2 + -1;
        }
      }
      TPZManVector<int,_10>::operator=(&this_00->super_TPZManVector<int,_10>,&local_70);
      TPZManVector<int,_10>::~TPZManVector(&local_70);
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TPZAdmChunkVector::Resize. Bad parameter newsize."
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZAdmChunkVector<T, EXP>::Resize(const int newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TPZAdmChunkVector::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    TPZChunkVector<T, EXP>::Resize(newsize);

    //   int sizechunk = 1 << EXP;
    int nchunks = fNFree.NElements();
    int chunksneeded = this->fVec.NElements(); // equivalent to newsize>>fExponent??

    fNFree.Resize(chunksneeded);

    for (int i = nchunks; i < chunksneeded; i++) {
        fNFree[i] = 0;
    }

    if (chunksneeded > nchunks) return;

    // delete all free indexes which are above the new size
    // update the number of free elements of the last chunk
    TPZStack<int> temp(fFree);
    temp.Resize(0);

    while (fFree.NElements() > 0) {
        int index = fFree.Pop();
        if (index < newsize)
            temp.Push(index);
        else {
            int chunk = index >> EXP;

            if (chunk == chunksneeded - 1)
                fNFree[chunksneeded - 1]--;
        }
    }

    fFree = temp;
}